

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildAndTestHandler::ProcessHandler(cmCTestBuildAndTestHandler *this)

{
  int iVar1;
  int retv;
  string local_30 [8];
  string output;
  cmCTestBuildAndTestHandler *this_local;
  
  output.field_2._8_8_ = this;
  std::__cxx11::string::operator=((string *)&this->Output,"");
  std::__cxx11::string::string(local_30);
  cmSystemTools::ResetErrorOccuredFlag();
  iVar1 = RunCMakeAndTest(this,&this->Output);
  cmSystemTools::ResetErrorOccuredFlag();
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessHandler()
{
  this->Output = "";
  std::string output;
  cmSystemTools::ResetErrorOccuredFlag();
  int retv = this->RunCMakeAndTest(&this->Output);
  cmSystemTools::ResetErrorOccuredFlag();
  return retv;
}